

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O3

lyd_diff_userord *
lyd_diff_userord_get(lyd_node *first,lysc_node *schema,lyd_diff_userord **userord)

{
  lyd_node **pplVar1;
  long lVar2;
  lyd_node *in_RAX;
  long *plVar3;
  long lVar4;
  lyd_node *plVar5;
  long *plVar6;
  lyd_diff_userord *plVar7;
  lyd_node **pplVar8;
  long lVar9;
  lyd_diff_userord *plVar10;
  lyd_node *iter;
  lyd_node *local_38;
  
  plVar7 = *userord;
  local_38 = in_RAX;
  if (plVar7 == (lyd_diff_userord *)0x0) {
    plVar3 = (long *)malloc(0x20);
    if (plVar3 != (long *)0x0) {
      *plVar3 = 1;
      lVar4 = 1;
      goto LAB_00118d1e;
    }
  }
  else {
    pplVar1 = plVar7[-1].inst;
    plVar10 = plVar7;
    for (pplVar8 = pplVar1; pplVar8 != (lyd_node **)0x0; pplVar8 = (lyd_node **)((long)pplVar8 + -1)
        ) {
      if (plVar10->schema == schema) {
        return plVar10;
      }
      plVar10 = plVar10 + 1;
    }
    plVar7[-1].inst = (lyd_node **)((long)pplVar1 + 1);
    plVar3 = (long *)realloc(&plVar7[-1].inst,(long)pplVar1 * 0x18 + 0x20);
    if (plVar3 != (long *)0x0) {
      lVar4 = *plVar3;
LAB_00118d1e:
      *userord = (lyd_diff_userord *)(plVar3 + 1);
      plVar7 = (lyd_diff_userord *)(plVar3 + lVar4 * 3 + -2);
      plVar7->schema = schema;
      plVar7->pos = 0;
      plVar7->inst = (lyd_node **)0x0;
      if (first == (lyd_node *)0x0) {
        return plVar7;
      }
      plVar5 = lyd_first_sibling(first);
      lyd_find_sibling_val(plVar5,first->schema,(char *)0x0,0,&local_38);
      plVar5 = local_38;
      do {
        if (plVar5 == (lyd_node *)0x0) {
          return plVar7;
        }
        if (plVar5->schema != first->schema) {
          return plVar7;
        }
        lVar9 = plVar3[lVar4 * 3];
        local_38 = plVar5;
        if (lVar9 == 0) {
          plVar6 = (long *)malloc(0x10);
          if (plVar6 == (long *)0x0) goto LAB_00118e07;
          *plVar6 = 1;
          lVar9 = 1;
        }
        else {
          lVar2 = *(long *)(lVar9 + -8);
          *(long *)(lVar9 + -8) = lVar2 + 1;
          plVar6 = (long *)realloc((void *)(lVar9 + -8),lVar2 * 8 + 0x10);
          if (plVar6 == (long *)0x0) {
            plVar7 = (lyd_diff_userord *)plVar3[lVar4 * 3];
            goto LAB_00118e03;
          }
          lVar9 = *plVar6;
          plVar5 = local_38;
        }
        plVar3[lVar4 * 3] = (long)(plVar6 + 1);
        plVar6[lVar9] = (long)plVar5;
        plVar5 = plVar5->next;
      } while( true );
    }
    plVar7 = *userord;
LAB_00118e03:
    plVar7[-1].inst = (lyd_node **)((long)plVar7[-1].inst + -1);
  }
LAB_00118e07:
  ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
         "lyd_diff_userord_get");
  return (lyd_diff_userord *)0x0;
}

Assistant:

static struct lyd_diff_userord *
lyd_diff_userord_get(const struct lyd_node *first, const struct lysc_node *schema, struct lyd_diff_userord **userord)
{
    struct lyd_diff_userord *item;
    struct lyd_node *iter;
    const struct lyd_node **node;
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(*userord, u) {
        if ((*userord)[u].schema == schema) {
            return &(*userord)[u];
        }
    }

    /* it was not added yet, add it now */
    LY_ARRAY_NEW_RET(schema->module->ctx, *userord, item, NULL);

    item->schema = schema;
    item->pos = 0;
    item->inst = NULL;

    /* store all the instance pointers in the current order */
    if (first) {
        LYD_LIST_FOR_INST(lyd_first_sibling(first), first->schema, iter) {
            LY_ARRAY_NEW_RET(schema->module->ctx, item->inst, node, NULL);
            *node = iter;
        }
    }

    return item;
}